

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

void __thiscall QtMWidgets::TableView::TableView(TableView *this,QWidget *parent)

{
  TableViewPrivate *this_00;
  TableViewPrivate *this_01;
  TableViewPrivate *d;
  QWidget *parent_local;
  TableView *this_local;
  
  *(undefined ***)&(this->super_ScrollArea).super_AbstractScrollArea = &PTR_metaObject_00235a68;
  *(undefined ***)&(this->super_ScrollArea).super_AbstractScrollArea.field_0x10 =
       &PTR__TableView_00235c30;
  this_00 = (TableViewPrivate *)operator_new(0xf0);
  TableViewPrivate::TableViewPrivate(this_00,this);
  ScrollArea::ScrollArea(&this->super_ScrollArea,(ScrollAreaPrivate *)this_00,parent);
  *(undefined ***)&(this->super_ScrollArea).super_AbstractScrollArea = &PTR_metaObject_00235a68;
  *(undefined ***)&(this->super_ScrollArea).super_AbstractScrollArea.field_0x10 =
       &PTR__TableView_00235c30;
  this_01 = d_func(this);
  TableViewPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

TableView::TableView( QWidget * parent )
	:	ScrollArea( new TableViewPrivate( this ), parent )
{
	TableViewPrivate * d = d_func();
	d->init();
}